

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# win_helper.c
# Opt level: O1

void cpu_gl_switch_gregs_sparc64(CPUSPARCState_conflict1 *env,uint32_t new_gl)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = (new_gl & 7) << 3;
  uVar1 = (env->gl & 7) << 3;
  if (uVar2 != uVar1) {
    env->glregs[uVar1] = env->gregs[0];
    env->glregs[(ulong)uVar1 + 1] = env->gregs[1];
    env->glregs[(ulong)uVar1 + 2] = env->gregs[2];
    env->glregs[(ulong)uVar1 + 3] = env->gregs[3];
    env->glregs[(ulong)uVar1 + 4] = env->gregs[4];
    env->glregs[(ulong)uVar1 + 5] = env->gregs[5];
    env->glregs[(ulong)uVar1 + 6] = env->gregs[6];
    env->glregs[(ulong)uVar1 + 7] = env->gregs[7];
    env->gregs[0] = env->glregs[uVar2];
    env->gregs[1] = env->glregs[(ulong)uVar2 + 1];
    env->gregs[2] = env->glregs[(ulong)uVar2 + 2];
    env->gregs[3] = env->glregs[(ulong)uVar2 + 3];
    env->gregs[4] = env->glregs[(ulong)uVar2 + 4];
    env->gregs[5] = env->glregs[(ulong)uVar2 + 5];
    env->gregs[6] = env->glregs[(ulong)uVar2 + 6];
    env->gregs[7] = env->glregs[(ulong)uVar2 + 7];
  }
  return;
}

Assistant:

static inline uint64_t *get_gl_gregset(CPUSPARCState *env, uint32_t gl)
{
    return env->glregs + (gl & 7) * 8;
}